

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,Index *jointObservations)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  Index IVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar10 [64];
  undefined1 extraout_var_00 [56];
  
  uVar3 = (ulong)t;
  puVar1 = (this->_m_firstJOHIforT).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->_m_firstJOHIforT).
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    IVar4 = Globals::CastLIndexToIndex(puVar1[uVar3]);
    uVar5 = (**(code **)((long)*this->_m_madp + 200))();
    auVar10._8_56_ = extraout_var;
    auVar10._0_8_ = extraout_XMM0_Qa;
    if (t != 0) {
      uVar9 = (ulong)IVar4;
      auVar2 = vcvtusi2sd_avx512f(auVar10._0_16_,uVar5);
      iVar7 = t - 1;
      lVar8 = 0;
      do {
        auVar11._0_8_ = pow(auVar2._0_8_,(double)iVar7);
        auVar11._8_56_ = extraout_var_00;
        lVar6 = vcvttsd2usi_avx512f(auVar11._0_16_);
        uVar9 = uVar9 + (ulong)*(uint *)((long)jointObservations + lVar8) * lVar6;
        IVar4 = (Index)uVar9;
        lVar8 = lVar8 + 4;
        iVar7 = iVar7 + -1;
      } while (uVar3 << 2 != lVar8);
    }
    return IVar4;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex(
        Index t, const Index jointObservations[] ) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstJOHIforT.at(t)), 
                jointObservations,
                GetNrJointObservations()
                )
          );    
/*
    size_t this_JOHI=_m_firstJOHIforT.at(t);
    size_t nrJO = GetNrJointObservations();
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrJO, (double)(exponent));
        this_JOHI += jointObservations[ts] * b;
    }
    return(this_JOHI);*/
}